

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::MapKeySorter::MapKeyComparator::operator()
          (MapKeyComparator *this,MapKey *a,MapKey *b)

{
  bool bVar1;
  CppType CVar2;
  int32 iVar3;
  int32 iVar4;
  uint32 uVar5;
  uint32 uVar6;
  uint uVar7;
  int64 iVar8;
  int64 iVar9;
  uint64 uVar10;
  uint64 uVar11;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff08;
  LogLevel_conflict level;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  MapKey *in_stack_ffffffffffffff60;
  MapKey *in_stack_ffffffffffffff90;
  bool local_1;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  CVar2 = MapKey::type(in_stack_ffffffffffffff60);
  switch(CVar2) {
  case CPPTYPE_INT32:
    iVar3 = MapKey::GetInt32Value(in_stack_ffffffffffffff90);
    iVar4 = MapKey::GetInt32Value(in_stack_ffffffffffffff90);
    local_1 = iVar3 < iVar4;
    break;
  case CPPTYPE_INT64:
    iVar8 = MapKey::GetInt64Value(in_stack_ffffffffffffff90);
    iVar9 = MapKey::GetInt64Value(in_stack_ffffffffffffff90);
    local_1 = iVar8 < iVar9;
    break;
  case CPPTYPE_UINT32:
    uVar5 = MapKey::GetUInt32Value(in_stack_ffffffffffffff90);
    uVar6 = MapKey::GetUInt32Value(in_stack_ffffffffffffff90);
    local_1 = uVar5 < uVar6;
    break;
  case CPPTYPE_UINT64:
    uVar10 = MapKey::GetUInt64Value(in_stack_ffffffffffffff90);
    uVar11 = MapKey::GetUInt64Value(in_stack_ffffffffffffff90);
    local_1 = uVar10 < uVar11;
    break;
  default:
    this_00 = (LogMessage *)&stack0xffffffffffffff58;
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),level,
               (char *)this_00,in_stack_fffffffffffffefc);
    LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    LogMessage::~LogMessage((LogMessage *)0x464a39);
    local_1 = true;
    break;
  case CPPTYPE_BOOL:
    bVar1 = MapKey::GetBoolValue(in_stack_ffffffffffffff90);
    uVar7 = (uint)bVar1;
    bVar1 = MapKey::GetBoolValue(in_stack_ffffffffffffff90);
    local_1 = (int)uVar7 < (int)(uint)bVar1;
    break;
  case CPPTYPE_STRING:
    MapKey::GetStringValue_abi_cxx11_(in_stack_ffffffffffffff90);
    MapKey::GetStringValue_abi_cxx11_(in_stack_ffffffffffffff90);
    local_1 = std::operator<(in_stack_ffffffffffffff00,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  return local_1;
}

Assistant:

bool operator()(const MapKey& a, const MapKey& b) const {
      GOOGLE_DCHECK(a.type() == b.type());
      switch (a.type()) {
#define CASE_TYPE(CppType, CamelCppType)                                \
  case FieldDescriptor::CPPTYPE_##CppType: {                            \
    return a.Get##CamelCppType##Value() < b.Get##CamelCppType##Value(); \
  }
        CASE_TYPE(STRING, String)
        CASE_TYPE(INT64, Int64)
        CASE_TYPE(INT32, Int32)
        CASE_TYPE(UINT64, UInt64)
        CASE_TYPE(UINT32, UInt32)
        CASE_TYPE(BOOL, Bool)
#undef CASE_TYPE

        default:
          GOOGLE_LOG(DFATAL) << "Invalid key for map field.";
          return true;
      }
    }